

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

int __thiscall
glcts::TessellationShaderTessellationTests::init
          (TessellationShaderTessellationTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_00;
  TessellationShaderTessellationgl_TessCoord *pTVar1;
  TessellationShaderTessellationInputPatchDiscard *this_01;
  TessellationShaderTessellationMaxInOut *this_02;
  
  this_00 = (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
            operator_new(0x2e0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TessellationShaderTessellationgl_TessCoord *)operator_new(0x2e8);
  TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,TESSELLATION_TEST_TYPE_FIRST
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TessellationShaderTessellationgl_TessCoord *)operator_new(0x2e8);
  TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,TESSELLATION_TEST_TYPE_TES);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  this_01 = (TessellationShaderTessellationInputPatchDiscard *)operator_new(0x2e0);
  TessellationShaderTessellationInputPatchDiscard::TessellationShaderTessellationInputPatchDiscard
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TessellationShaderTessellationMaxInOut *)operator_new(800);
  TessellationShaderTessellationMaxInOut::TessellationShaderTessellationMaxInOut
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void TessellationShaderTessellationTests::init(void)
{
	addChild(
		new glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID(m_context, m_extParams));
	addChild(
		new glcts::TessellationShaderTessellationgl_TessCoord(m_context, m_extParams, TESSELLATION_TEST_TYPE_TCS_TES));
	addChild(new glcts::TessellationShaderTessellationgl_TessCoord(m_context, m_extParams, TESSELLATION_TEST_TYPE_TES));
	addChild(new glcts::TessellationShaderTessellationInputPatchDiscard(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTessellationMaxInOut(m_context, m_extParams));
}